

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  parasail_result_t *ppVar25;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  long lVar29;
  short sVar30;
  short sVar31;
  ulong uVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  long lVar40;
  long lVar41;
  __m128i *palVar42;
  uint uVar43;
  long lVar44;
  long lVar45;
  short sVar46;
  long lVar47;
  undefined4 uVar50;
  undefined4 uVar51;
  ulong uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  ulong uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ushort uVar88;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ushort uVar103;
  undefined1 auVar96 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar107;
  undefined1 in_XMM5 [16];
  short sVar110;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  ulong uVar111;
  undefined1 in_XMM6 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  short sVar114;
  ushort uVar115;
  ushort uVar116;
  short sVar117;
  ushort uVar118;
  ushort uVar119;
  short sVar120;
  ushort uVar121;
  ushort uVar122;
  short sVar123;
  ushort uVar124;
  ushort uVar125;
  short sVar126;
  ushort uVar127;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  ushort uVar132;
  ushort uVar133;
  ushort uVar134;
  short sVar136;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  undefined1 auVar135 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined4 uVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  int iVar154;
  int iVar158;
  int iVar159;
  int iVar160;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar163 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_16_t h;
  int local_334;
  undefined1 local_2c8 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  long local_218;
  int local_208;
  short local_1f8;
  short sStack_1f6;
  short local_1e8;
  short sStack_1e6;
  ushort local_f8;
  ushort uStack_f6;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX;
  short sVar48;
  short sVar49;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_4();
        }
        else {
          uVar38 = CONCAT44(0,s2Len);
          if (s2Len < 1) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_2();
          }
          else {
            uVar37 = (ulong)(uint)gap;
            if (gap < 0) {
              parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_1();
            }
            else {
              uVar43 = uVar3 - 1;
              uVar84 = (ulong)uVar3 + 7;
              uVar32 = uVar84 >> 3;
              uVar52 = (ulong)uVar43 % uVar32;
              iVar20 = (int)(uVar43 / uVar32);
              iVar35 = -open;
              iVar22 = ppVar5->min;
              iVar24 = -iVar22;
              if (iVar22 != iVar35 && SBORROW4(iVar22,iVar35) == iVar22 + open < 0) {
                iVar24 = open;
              }
              pvVar6 = (profile->profile16).matches;
              uVar21 = (uint)CONCAT62((int6)((ulong)pvVar6 >> 0x10),0x7ffe - (short)ppVar5->max);
              local_268._0_4_ = uVar21;
              pvVar7 = (profile->profile16).similar;
              ppVar25 = parasail_result_new_table3((uint)uVar84 & 0x7ffffff8,s2Len);
              if (ppVar25 != (parasail_result_t *)0x0) {
                ppVar25->flag =
                     (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                     (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar25->flag |
                     0x8230402;
                b = parasail_memalign___m128i(0x10,uVar32);
                b_00 = parasail_memalign___m128i(0x10,uVar32);
                b_01 = parasail_memalign___m128i(0x10,uVar32);
                b_02 = parasail_memalign___m128i(0x10,uVar32);
                ptr = parasail_memalign___m128i(0x10,uVar32);
                b_03 = parasail_memalign___m128i(0x10,uVar32);
                b_04 = parasail_memalign___m128i(0x10,uVar32);
                b_05 = parasail_memalign___m128i(0x10,uVar32);
                ptr_00 = parasail_memalign___m128i(0x10,uVar32);
                ptr_01 = parasail_memalign___m128i(0x10,uVar32);
                ptr_02 = parasail_memalign___m128i(0x10,uVar32);
                ptr_03 = parasail_memalign___m128i(0x10,uVar32);
                ptr_04 = parasail_memalign___m128i(0x10,uVar32);
                ptr_05 = parasail_memalign___m128i(0x10,uVar32);
                local_288._8_8_ = local_288._0_8_;
                local_288._0_8_ = uVar38;
                ptr_06 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
                auVar104 = (undefined1  [16])0x0;
                auVar53._0_8_ = -(ulong)(b == (__m128i *)0x0);
                auVar53._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
                auVar54._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
                auVar54._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
                auVar53 = packssdw(auVar53,auVar54);
                auVar78._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
                auVar78._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
                auVar55._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
                auVar55._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
                auVar78 = packssdw(auVar78,auVar55);
                auVar53 = packssdw(auVar53,auVar78);
                if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                      ptr_05 != (__m128i *)0x0) &&
                     ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                     ptr_02 != (__m128i *)0x0)) && ptr_06 != (int16_t *)0x0) &&
                    ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  && (auVar53 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                 (auVar53 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && (auVar53 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                               (auVar53 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar53 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar53 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar53 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar53 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar53 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar53 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar53 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar53[0xf])) {
                  iVar22 = s2Len + -1;
                  uVar23 = 7 - iVar20;
                  auVar53 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                  uVar50 = auVar53._0_4_;
                  local_278 = ZEXT416((uint)gap);
                  auVar53 = pshuflw(local_278,local_278,0);
                  uVar51 = auVar53._0_4_;
                  c[1]._0_4_ = iVar24 - 0x7fff;
                  auVar78 = pshuflw(ZEXT416((uint)c[1]),ZEXT416((uint)c[1]),0);
                  local_1f8 = auVar78._0_2_;
                  sStack_1f6 = auVar78._2_2_;
                  auVar54 = pshuflw(ZEXT416(uVar21),ZEXT416(uVar21),0);
                  auVar53 = pshuflw(ZEXT416(uVar23),ZEXT416(uVar23),0);
                  local_1e8 = auVar53._0_2_;
                  sStack_1e6 = auVar53._2_2_;
                  uVar21 = (uint)uVar32;
                  auVar79 = pshufb(ZEXT416(uVar21),_DAT_00906db0);
                  auVar53 = pshufb(ZEXT416(-(uVar21 * gap)),_DAT_00906db0);
                  auVar85 = paddsw(auVar53,ZEXT416((uint)c[1] & 0xffff));
                  c[0] = uVar32;
                  c[1]._4_4_ = 0;
                  auVar146._8_8_ = uVar37;
                  parasail_memset___m128i(b_03,c,uVar37);
                  c_00[1] = extraout_RDX;
                  c_00[0] = uVar32;
                  parasail_memset___m128i(b_04,c_00,auVar146._8_8_);
                  c_01[1] = extraout_RDX_00;
                  c_01[0] = uVar32;
                  parasail_memset___m128i(b_05,c_01,auVar146._8_8_);
                  c_02[1] = extraout_RDX_01;
                  c_02[0] = uVar32;
                  parasail_memset___m128i(b,c_02,auVar146._8_8_);
                  c_03[1] = extraout_RDX_02;
                  c_03[0] = uVar32;
                  parasail_memset___m128i(b_00,c_03,auVar146._8_8_);
                  c_04[1] = extraout_RDX_03;
                  c_04[0] = uVar32;
                  parasail_memset___m128i(b_01,c_04,auVar146._8_8_);
                  c_05[1] = extraout_RDX_04;
                  c_05[0] = uVar32;
                  parasail_memset___m128i(b_02,c_05,auVar146._8_8_);
                  auVar142._4_4_ = uVar51;
                  auVar142._0_4_ = uVar51;
                  auVar142._8_4_ = uVar51;
                  auVar142._12_4_ = uVar51;
                  auVar112._4_4_ = uVar50;
                  auVar112._0_4_ = uVar50;
                  auVar112._8_4_ = uVar50;
                  auVar112._12_4_ = uVar50;
                  auVar89 = psubsw((undefined1  [16])0x0,auVar112);
                  uVar26 = (ulong)(uVar21 - 1);
                  lVar27 = uVar26 << 4;
                  auVar55 = pmovsxbw(auVar112,0x101010101010101);
                  auVar146._8_8_ = uVar32;
                  auVar53 = auVar55;
                  do {
                    *(undefined1 (*) [16])((long)*ptr_04 + lVar27) = auVar89;
                    *(undefined1 (*) [16])((long)*ptr_05 + lVar27) = auVar53;
                    auVar89 = psubsw(auVar89,auVar142);
                    auVar53 = paddsw(auVar53,auVar55);
                    lVar27 = lVar27 + -0x10;
                    iVar24 = (int)auVar146._8_8_;
                    uVar28 = iVar24 - 1;
                    auVar146._8_8_ = (ulong)uVar28;
                  } while (uVar28 != 0 && 0 < iVar24);
                  lVar27 = (long)iVar35;
                  auVar146._8_8_ = 0;
                  do {
                    lVar40 = 0;
                    lVar36 = lVar27;
                    do {
                      lVar41 = lVar36;
                      if (s1_beg != 0) {
                        lVar41 = 0;
                      }
                      if (lVar41 < -0x7fff) {
                        lVar41 = -0x8000;
                      }
                      *(short *)((long)&local_48 + lVar40 * 2) = (short)lVar41;
                      lVar40 = lVar40 + 1;
                      lVar36 = lVar36 - uVar32 * uVar37;
                    } while (lVar40 != 8);
                    ptr[auVar146._8_8_][0] = local_48;
                    ptr[auVar146._8_8_][1] = lStack_40;
                    auVar146._8_8_ = auVar146._8_8_ + 1;
                    lVar27 = lVar27 - uVar37;
                  } while (auVar146._8_8_ != uVar32);
                  *ptr_06 = 0;
                  auVar53 = _DAT_00906ca0;
                  lVar27 = uVar38 - 1;
                  auVar89._8_4_ = (int)lVar27;
                  auVar89._0_8_ = lVar27;
                  auVar89._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  auVar86._4_4_ = gap;
                  auVar86._0_4_ = gap;
                  auVar86._8_4_ = gap;
                  auVar86._12_4_ = gap;
                  iVar24 = -gap;
                  auVar55 = pmovsxbq(auVar104,0x504);
                  auVar104 = pmovsxbq(in_XMM5,0x302);
                  auVar112 = pmovsxbq(in_XMM6,0x100);
                  auVar89 = auVar89 ^ _DAT_00906ca0;
                  auVar105._8_4_ = 0xffffffff;
                  auVar105._0_8_ = 0xffffffffffffffff;
                  auVar105._12_4_ = 0xffffffff;
                  auVar142 = pmovsxbd(in_XMM9,0x7060504);
                  auVar146 = pmovsxwd(in_XMM10,0x8000800080008000);
                  iVar34 = 0;
                  uVar37 = 0;
                  do {
                    uVar148 = (undefined4)uVar37;
                    auVar149._8_4_ = uVar148;
                    auVar149._0_8_ = uVar37;
                    auVar149._12_4_ = (int)(uVar37 >> 0x20);
                    auVar161 = (auVar149 | auVar112) ^ auVar53;
                    lVar27 = auVar89._0_8_;
                    auVar162._0_8_ = -(ulong)(lVar27 < auVar161._0_8_);
                    lVar36 = auVar89._8_8_;
                    auVar162._8_8_ = -(ulong)(lVar36 < auVar161._8_8_);
                    auVar161 = pshuflw(in_XMM15,auVar162,0xe8);
                    in_XMM15 = packssdw(auVar161 ^ auVar105,auVar161 ^ auVar105);
                    iVar159 = gap * 2 + iVar34;
                    iVar160 = gap * 3 + iVar34;
                    auVar161._4_4_ = open;
                    auVar161._0_4_ = iVar34;
                    auVar161._12_4_ = iVar160;
                    auVar161._8_4_ = iVar159;
                    iVar154 = iVar35 - iVar34;
                    iVar158 = iVar24 - open;
                    iVar159 = iVar35 - iVar159;
                    iVar160 = iVar35 - iVar160;
                    iVar8 = auVar146._0_4_;
                    iVar9 = auVar146._4_4_;
                    iVar10 = auVar146._8_4_;
                    iVar11 = auVar146._12_4_;
                    uVar116 = 0;
                    if ((in_XMM15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      uVar119 = (ushort)(iVar154 < iVar8) * auVar146._0_2_ |
                                (ushort)(iVar154 >= iVar8) * (short)iVar154;
                      if (s2_beg != 0) {
                        uVar119 = uVar116;
                      }
                      ptr_06[uVar37 + 1] = uVar119;
                    }
                    auVar162 = packssdw(auVar162,auVar162);
                    auVar162 = packssdw(auVar162 ^ auVar105,auVar162 ^ auVar105);
                    if ((auVar162 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      uVar119 = (ushort)(iVar158 < iVar9) * auVar146._4_2_ |
                                (ushort)(iVar158 >= iVar9) * (short)iVar158;
                      if (s2_beg != 0) {
                        uVar119 = uVar116;
                      }
                      ptr_06[uVar37 + 2] = uVar119;
                    }
                    auVar162 = (auVar149 | auVar104) ^ auVar53;
                    auVar163._0_8_ = -(ulong)(lVar27 < auVar162._0_8_);
                    auVar163._8_8_ = -(ulong)(lVar36 < auVar162._8_8_);
                    auVar161 = packssdw(auVar161,auVar163);
                    auVar161 = packssdw(auVar161 ^ auVar105,auVar161 ^ auVar105);
                    if ((auVar161 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      uVar119 = (ushort)(iVar159 < iVar10) * auVar146._8_2_ |
                                (ushort)(iVar159 >= iVar10) * (short)iVar159;
                      if (s2_beg != 0) {
                        uVar119 = uVar116;
                      }
                      ptr_06[uVar37 + 3] = uVar119;
                    }
                    auVar161 = pshufhw(auVar161,auVar163,0x84);
                    auVar161 = packssdw(auVar161 ^ auVar105,auVar161 ^ auVar105);
                    if ((auVar161 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      uVar119 = (ushort)(iVar160 < iVar11) * auVar146._12_2_ |
                                (ushort)(iVar160 >= iVar11) * (short)iVar160;
                      if (s2_beg != 0) {
                        uVar119 = uVar116;
                      }
                      ptr_06[uVar37 + 4] = uVar119;
                    }
                    auVar90._4_4_ = uVar148;
                    auVar90._0_4_ = uVar148;
                    auVar90._8_4_ = uVar148;
                    auVar90._12_4_ = uVar148;
                    auVar161 = pmulld(auVar90 | auVar142,auVar86);
                    iVar159 = iVar35 - auVar161._0_4_;
                    iVar160 = iVar35 - auVar161._4_4_;
                    iVar154 = iVar35 - auVar161._8_4_;
                    iVar158 = iVar35 - auVar161._12_4_;
                    auVar162 = (auVar149 | auVar55) ^ auVar53;
                    auVar155._0_8_ = -(ulong)(lVar27 < auVar162._0_8_);
                    auVar155._8_8_ = -(ulong)(lVar36 < auVar162._8_8_);
                    auVar161 = pshuflw(auVar161,auVar155,0xe8);
                    auVar161 = packssdw(auVar161 ^ auVar105,auVar161 ^ auVar105);
                    if ((auVar161 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      uVar119 = (ushort)(iVar159 < iVar8) * auVar146._0_2_ |
                                (ushort)(iVar159 >= iVar8) * (short)iVar159;
                      if (s2_beg != 0) {
                        uVar119 = uVar116;
                      }
                      ptr_06[uVar37 + 5] = uVar119;
                    }
                    auVar162 = packssdw(auVar155,auVar155);
                    auVar161 = packssdw(auVar161,auVar162 ^ auVar105);
                    if ((auVar161 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      uVar119 = (ushort)(iVar160 < iVar9) * auVar146._4_2_ |
                                (ushort)(iVar160 >= iVar9) * (short)iVar160;
                      if (s2_beg != 0) {
                        uVar119 = uVar116;
                      }
                      ptr_06[uVar37 + 6] = uVar119;
                    }
                    auVar149 = (auVar149 | _DAT_00903ac0) ^ auVar53;
                    auVar150._0_8_ = -(ulong)(lVar27 < auVar149._0_8_);
                    auVar150._8_8_ = -(ulong)(lVar36 < auVar149._8_8_);
                    auVar161 = packssdw(auVar161,auVar150);
                    auVar161 = packssdw(auVar161 ^ auVar105,auVar161 ^ auVar105);
                    if ((auVar161 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      uVar119 = (ushort)(iVar154 < iVar10) * auVar146._8_2_ |
                                (ushort)(iVar154 >= iVar10) * (short)iVar154;
                      if (s2_beg != 0) {
                        uVar119 = uVar116;
                      }
                      ptr_06[uVar37 + 7] = uVar119;
                    }
                    auVar161 = pshufhw(auVar161,auVar150,0x84);
                    auVar161 = packssdw(auVar161 ^ auVar105,auVar161 ^ auVar105);
                    if ((auVar161 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      uVar119 = (ushort)(iVar158 < iVar11) * auVar146._12_2_ |
                                (ushort)(iVar158 >= iVar11) * (short)iVar158;
                      if (s2_beg != 0) {
                        uVar119 = uVar116;
                      }
                      ptr_06[uVar37 + 8] = uVar119;
                    }
                    uVar37 = uVar37 + 8;
                    iVar24 = iVar24 + gap * -8;
                    iVar34 = iVar34 + gap * 8;
                  } while ((s2Len + 7U & 0xfffffff8) != uVar37);
                  palVar42 = ptr + uVar52;
                  lVar44 = uVar32 * uVar38;
                  lVar27 = lVar44 * 4;
                  lVar36 = lVar44 * 8;
                  lVar40 = lVar44 * 0xc;
                  lVar12 = lVar44 * 0x1c;
                  lVar45 = lVar44 * 0x10;
                  auVar104._4_2_ = local_1f8;
                  auVar104._0_4_ = auVar78._0_4_;
                  auVar104._6_2_ = sStack_1f6;
                  auVar104._8_2_ = local_1f8;
                  auVar104._10_2_ = sStack_1f6;
                  auVar104._12_2_ = local_1f8;
                  auVar104._14_2_ = sStack_1f6;
                  local_f8 = auVar54._0_2_;
                  uStack_f6 = auVar54._2_2_;
                  lVar41 = lVar44 * 0x14;
                  lVar44 = lVar44 * 0x18;
                  local_218 = 0;
                  auVar56._4_4_ = uVar50;
                  auVar56._0_4_ = uVar50;
                  auVar56._8_4_ = uVar50;
                  auVar56._12_4_ = uVar50;
                  uVar37 = 0;
                  auVar146 = auVar104;
                  auVar106 = auVar104;
                  auVar108 = auVar104;
                  auVar113 = auVar104;
                  uVar116 = local_f8;
                  uVar119 = uStack_f6;
                  uVar122 = local_f8;
                  uVar125 = uStack_f6;
                  uVar128 = local_f8;
                  uVar130 = uStack_f6;
                  uVar132 = local_f8;
                  uVar134 = uStack_f6;
                  local_334 = iVar22;
                  do {
                    uVar111 = ptr[uVar26][0];
                    uVar13 = b_03[uVar26][0];
                    uVar14 = b_04[uVar26][0];
                    uVar15 = b_05[uVar26][0];
                    auVar143._0_8_ = uVar13 << 0x10;
                    auVar143._8_8_ = b_03[uVar26][1] << 0x10 | uVar13 >> 0x30;
                    auVar147._0_8_ = uVar14 << 0x10;
                    auVar147._8_8_ = b_04[uVar26][1] << 0x10 | uVar14 >> 0x30;
                    auVar91._0_8_ = uVar15 << 0x10;
                    auVar91._8_8_ = b_05[uVar26][1] << 0x10 | uVar15 >> 0x30;
                    auVar151._8_8_ = ptr[uVar26][1] << 0x10 | uVar111 >> 0x30;
                    auVar151._0_8_ = uVar111 << 0x10 | (ulong)(ushort)ptr_06[uVar37];
                    lVar33 = uVar32 * (long)ppVar5->mapper[(byte)s2[uVar37]] * 0x10;
                    auVar135._4_2_ = local_1f8;
                    auVar135._0_4_ = auVar78._0_4_;
                    auVar135._6_2_ = sStack_1f6;
                    auVar135._8_2_ = local_1f8;
                    auVar135._10_2_ = sStack_1f6;
                    auVar135._12_2_ = local_1f8;
                    auVar135._14_2_ = sStack_1f6;
                    auVar80 = psubsw(auVar135,(undefined1  [16])*ptr_04);
                    auVar53 = (undefined1  [16])0x0;
                    lVar47 = 0;
                    local_2c8 = (undefined1  [16])0x0;
                    local_258 = (undefined1  [16])0x0;
                    do {
                      auVar54 = *(undefined1 (*) [16])((long)*ptr + lVar47);
                      auVar55 = *(undefined1 (*) [16])((long)*b_03 + lVar47);
                      auVar112 = psubsw(auVar54,auVar56);
                      auVar17._4_4_ = uVar51;
                      auVar17._0_4_ = uVar51;
                      auVar17._8_4_ = uVar51;
                      auVar17._12_4_ = uVar51;
                      auVar142 = psubsw(*(undefined1 (*) [16])((long)*b + lVar47),auVar17);
                      sVar48 = auVar112._0_2_;
                      sVar114 = auVar142._0_2_;
                      auVar57._0_2_ = -(ushort)(sVar114 < sVar48);
                      sVar64 = auVar112._2_2_;
                      sVar117 = auVar142._2_2_;
                      auVar57._2_2_ = -(ushort)(sVar117 < sVar64);
                      sVar66 = auVar112._4_2_;
                      sVar120 = auVar142._4_2_;
                      auVar57._4_2_ = -(ushort)(sVar120 < sVar66);
                      sVar68 = auVar112._6_2_;
                      sVar123 = auVar142._6_2_;
                      auVar57._6_2_ = -(ushort)(sVar123 < sVar68);
                      sVar70 = auVar112._8_2_;
                      sVar126 = auVar142._8_2_;
                      auVar57._8_2_ = -(ushort)(sVar126 < sVar70);
                      sVar72 = auVar112._10_2_;
                      sVar30 = auVar142._10_2_;
                      auVar57._10_2_ = -(ushort)(sVar30 < sVar72);
                      sVar74 = auVar112._12_2_;
                      sVar31 = auVar142._12_2_;
                      sVar76 = auVar112._14_2_;
                      auVar57._12_2_ = -(ushort)(sVar31 < sVar74);
                      sVar46 = auVar142._14_2_;
                      auVar57._14_2_ = -(ushort)(sVar46 < sVar76);
                      auVar105 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar47),auVar55,
                                          auVar57);
                      auVar112 = *(undefined1 (*) [16])((long)*b_04 + lVar47);
                      auVar86 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar47),auVar112,
                                         auVar57);
                      auVar142 = *(undefined1 (*) [16])((long)*b_05 + lVar47);
                      auVar163 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar47),auVar142,
                                          auVar57);
                      auVar89 = paddsw(auVar80,*(undefined1 (*) [16])((long)*ptr_04 + lVar47));
                      sVar49 = auVar89._0_2_;
                      sVar107 = auVar135._0_2_;
                      auVar58._0_2_ = -(ushort)(sVar107 < sVar49);
                      sVar65 = auVar89._2_2_;
                      sVar110 = auVar135._2_2_;
                      auVar58._2_2_ = -(ushort)(sVar110 < sVar65);
                      sVar67 = auVar89._4_2_;
                      sVar136 = auVar135._4_2_;
                      auVar58._4_2_ = -(ushort)(sVar136 < sVar67);
                      sVar69 = auVar89._6_2_;
                      sVar137 = auVar135._6_2_;
                      auVar58._6_2_ = -(ushort)(sVar137 < sVar69);
                      sVar71 = auVar89._8_2_;
                      sVar138 = auVar135._8_2_;
                      auVar58._8_2_ = -(ushort)(sVar138 < sVar71);
                      sVar73 = auVar89._10_2_;
                      sVar139 = auVar135._10_2_;
                      auVar58._10_2_ = -(ushort)(sVar139 < sVar73);
                      sVar75 = auVar89._12_2_;
                      sVar140 = auVar135._12_2_;
                      sVar77 = auVar89._14_2_;
                      auVar58._12_2_ = -(ushort)(sVar140 < sVar75);
                      sVar141 = auVar135._14_2_;
                      auVar58._14_2_ = -(ushort)(sVar141 < sVar77);
                      local_258 = pblendvb(local_258,local_278,auVar58);
                      local_2c8 = pblendvb(local_2c8,local_288,auVar58);
                      uVar115 = (ushort)(sVar114 < sVar48) * sVar48 |
                                (ushort)(sVar114 >= sVar48) * sVar114;
                      uVar118 = (ushort)(sVar117 < sVar64) * sVar64 |
                                (ushort)(sVar117 >= sVar64) * sVar117;
                      uVar121 = (ushort)(sVar120 < sVar66) * sVar66 |
                                (ushort)(sVar120 >= sVar66) * sVar120;
                      uVar124 = (ushort)(sVar123 < sVar68) * sVar68 |
                                (ushort)(sVar123 >= sVar68) * sVar123;
                      uVar127 = (ushort)(sVar126 < sVar70) * sVar70 |
                                (ushort)(sVar126 >= sVar70) * sVar126;
                      uVar129 = (ushort)(sVar30 < sVar72) * sVar72 |
                                (ushort)(sVar30 >= sVar72) * sVar30;
                      uVar131 = (ushort)(sVar31 < sVar74) * sVar74 |
                                (ushort)(sVar31 >= sVar74) * sVar31;
                      uVar133 = (ushort)(sVar46 < sVar76) * sVar76 |
                                (ushort)(sVar46 >= sVar76) * sVar46;
                      auVar135._0_2_ =
                           (ushort)(sVar49 < sVar107) * sVar107 |
                           (ushort)(sVar49 >= sVar107) * sVar49;
                      auVar135._2_2_ =
                           (ushort)(sVar65 < sVar110) * sVar110 |
                           (ushort)(sVar65 >= sVar110) * sVar65;
                      auVar135._4_2_ =
                           (ushort)(sVar67 < sVar136) * sVar136 |
                           (ushort)(sVar67 >= sVar136) * sVar67;
                      auVar135._6_2_ =
                           (ushort)(sVar69 < sVar137) * sVar137 |
                           (ushort)(sVar69 >= sVar137) * sVar69;
                      auVar135._8_2_ =
                           (ushort)(sVar71 < sVar138) * sVar138 |
                           (ushort)(sVar71 >= sVar138) * sVar71;
                      auVar135._10_2_ =
                           (ushort)(sVar73 < sVar139) * sVar139 |
                           (ushort)(sVar73 >= sVar139) * sVar73;
                      auVar135._12_2_ =
                           (ushort)(sVar75 < sVar140) * sVar140 |
                           (ushort)(sVar75 >= sVar140) * sVar75;
                      auVar135._14_2_ =
                           (ushort)(sVar77 < sVar141) * sVar141 |
                           (ushort)(sVar77 >= sVar141) * sVar77;
                      auVar161 = paddsw(local_268,*(undefined1 (*) [16])((long)*ptr_05 + lVar47));
                      auVar53 = pblendvb(auVar53,auVar161,auVar58);
                      auVar162 = paddsw(auVar151,*(undefined1 (*) [16])
                                                  ((long)pvVar4 + lVar47 + lVar33));
                      auVar161 = paddsw(auVar143,*(undefined1 (*) [16])
                                                  ((long)pvVar6 + lVar47 + lVar33));
                      auVar149 = paddsw(auVar147,*(undefined1 (*) [16])
                                                  ((long)pvVar7 + lVar47 + lVar33));
                      sVar48 = auVar162._0_2_;
                      auVar59._0_2_ = -(ushort)(sVar48 < (short)uVar115);
                      sVar49 = auVar162._2_2_;
                      auVar59._2_2_ = -(ushort)(sVar49 < (short)uVar118);
                      sVar64 = auVar162._4_2_;
                      auVar59._4_2_ = -(ushort)(sVar64 < (short)uVar121);
                      sVar65 = auVar162._6_2_;
                      auVar59._6_2_ = -(ushort)(sVar65 < (short)uVar124);
                      sVar66 = auVar162._8_2_;
                      auVar59._8_2_ = -(ushort)(sVar66 < (short)uVar127);
                      sVar67 = auVar162._10_2_;
                      auVar59._10_2_ = -(ushort)(sVar67 < (short)uVar129);
                      sVar68 = auVar162._12_2_;
                      auVar59._12_2_ = -(ushort)(sVar68 < (short)uVar131);
                      sVar69 = auVar162._14_2_;
                      auVar59._14_2_ = -(ushort)(sVar69 < (short)uVar133);
                      local_278 = pblendvb(auVar161,auVar105,auVar59);
                      local_288 = pblendvb(auVar149,auVar86,auVar59);
                      auVar89 = pmovsxbw(auVar89,0x101010101010101);
                      auVar163 = paddsw(auVar163,auVar89);
                      auVar89 = paddsw(auVar91,auVar89);
                      local_268 = pblendvb(auVar89,auVar163,auVar59);
                      puVar1 = (ushort *)((long)*b + lVar47);
                      *puVar1 = uVar115;
                      puVar1[1] = uVar118;
                      puVar1[2] = uVar121;
                      puVar1[3] = uVar124;
                      puVar1[4] = uVar127;
                      puVar1[5] = uVar129;
                      puVar1[6] = uVar131;
                      puVar1[7] = uVar133;
                      *(undefined1 (*) [16])((long)*b_00 + lVar47) = auVar105;
                      *(undefined1 (*) [16])((long)*b_01 + lVar47) = auVar86;
                      *(undefined1 (*) [16])((long)*b_02 + lVar47) = auVar163;
                      uVar115 = (ushort)((short)uVar115 < sVar48) * sVar48 |
                                ((short)uVar115 >= sVar48) * uVar115;
                      uVar118 = (ushort)((short)uVar118 < sVar49) * sVar49 |
                                ((short)uVar118 >= sVar49) * uVar118;
                      uVar121 = (ushort)((short)uVar121 < sVar64) * sVar64 |
                                ((short)uVar121 >= sVar64) * uVar121;
                      uVar124 = (ushort)((short)uVar124 < sVar65) * sVar65 |
                                ((short)uVar124 >= sVar65) * uVar124;
                      auVar80._0_8_ = CONCAT26(uVar124,CONCAT24(uVar121,CONCAT22(uVar118,uVar115)));
                      auVar80._8_2_ =
                           (ushort)((short)uVar127 < sVar66) * sVar66 |
                           ((short)uVar127 >= sVar66) * uVar127;
                      auVar80._10_2_ =
                           (ushort)((short)uVar129 < sVar67) * sVar67 |
                           ((short)uVar129 >= sVar67) * uVar129;
                      auVar80._12_2_ =
                           (ushort)((short)uVar131 < sVar68) * sVar68 |
                           ((short)uVar131 >= sVar68) * uVar131;
                      auVar80._14_2_ =
                           (ushort)((short)uVar133 < sVar69) * sVar69 |
                           ((short)uVar133 >= sVar69) * uVar133;
                      *(undefined1 (*) [16])((long)*ptr + lVar47) = auVar162;
                      *(undefined1 (*) [16])((long)*b_03 + lVar47) = auVar161;
                      *(undefined1 (*) [16])((long)*b_04 + lVar47) = auVar149;
                      *(undefined1 (*) [16])((long)*b_05 + lVar47) = auVar89;
                      lVar47 = lVar47 + 0x10;
                      auVar91 = auVar142;
                      auVar143 = auVar55;
                      auVar147 = auVar112;
                      auVar151 = auVar54;
                    } while (uVar32 << 4 != lVar47);
                    lVar33 = local_278._8_8_;
                    uVar111 = local_278._0_8_;
                    local_278._0_8_ = uVar111 << 0x10;
                    local_278._8_8_ = lVar33 << 0x10 | uVar111 >> 0x30;
                    lVar33 = local_288._8_8_;
                    uVar111 = local_288._0_8_;
                    local_288._0_8_ = uVar111 << 0x10;
                    local_288._8_8_ = lVar33 << 0x10 | uVar111 >> 0x30;
                    lVar33 = local_268._8_8_;
                    uVar111 = local_268._0_8_;
                    local_268._0_8_ = uVar111 << 0x10;
                    local_268._8_8_ = lVar33 << 0x10 | uVar111 >> 0x30;
                    auVar81._8_8_ = auVar80._8_8_ << 0x10 | (ulong)uVar124;
                    uVar127 = ptr_06[uVar37 + 1];
                    auVar81._0_8_ = auVar80._0_8_ << 0x10 | (ulong)uVar127;
                    uVar111 = uVar37 + 1;
                    auVar54 = paddsw((undefined1  [16])*ptr_04,auVar81);
                    sVar48 = auVar54._0_2_;
                    auVar60._0_2_ = -(ushort)(sVar48 < (short)auVar135._0_2_);
                    sVar49 = auVar54._2_2_;
                    auVar60._2_2_ = -(ushort)(sVar49 < (short)auVar135._2_2_);
                    sVar64 = auVar54._4_2_;
                    auVar60._4_2_ = -(ushort)(sVar64 < (short)auVar135._4_2_);
                    sVar65 = auVar54._6_2_;
                    auVar60._6_2_ = -(ushort)(sVar65 < (short)auVar135._6_2_);
                    sVar66 = auVar54._8_2_;
                    auVar60._8_2_ = -(ushort)(sVar66 < (short)auVar135._8_2_);
                    sVar67 = auVar54._10_2_;
                    auVar60._10_2_ = -(ushort)(sVar67 < (short)auVar135._10_2_);
                    sVar68 = auVar54._12_2_;
                    auVar60._12_2_ = -(ushort)(sVar68 < (short)auVar135._12_2_);
                    sVar69 = auVar54._14_2_;
                    auVar60._14_2_ = -(ushort)(sVar69 < (short)auVar135._14_2_);
                    auVar92._0_2_ =
                         (sVar48 < (short)auVar135._0_2_) * auVar135._0_2_ |
                         (ushort)(sVar48 >= (short)auVar135._0_2_) * sVar48;
                    auVar92._2_2_ =
                         (sVar49 < (short)auVar135._2_2_) * auVar135._2_2_ |
                         (ushort)(sVar49 >= (short)auVar135._2_2_) * sVar49;
                    auVar92._4_2_ =
                         (sVar64 < (short)auVar135._4_2_) * auVar135._4_2_ |
                         (ushort)(sVar64 >= (short)auVar135._4_2_) * sVar64;
                    auVar92._6_2_ =
                         (sVar65 < (short)auVar135._6_2_) * auVar135._6_2_ |
                         (ushort)(sVar65 >= (short)auVar135._6_2_) * sVar65;
                    auVar92._8_2_ =
                         (sVar66 < (short)auVar135._8_2_) * auVar135._8_2_ |
                         (ushort)(sVar66 >= (short)auVar135._8_2_) * sVar66;
                    auVar92._10_2_ =
                         (sVar67 < (short)auVar135._10_2_) * auVar135._10_2_ |
                         (ushort)(sVar67 >= (short)auVar135._10_2_) * sVar67;
                    auVar92._12_2_ =
                         (sVar68 < (short)auVar135._12_2_) * auVar135._12_2_ |
                         (ushort)(sVar68 >= (short)auVar135._12_2_) * sVar68;
                    auVar92._14_2_ =
                         (sVar69 < (short)auVar135._14_2_) * auVar135._14_2_ |
                         (ushort)(sVar69 >= (short)auVar135._14_2_) * sVar69;
                    auVar112 = pblendvb(local_278,local_258,auVar60);
                    auVar55 = pblendvb(local_288,local_2c8,auVar60);
                    auVar54 = paddsw((undefined1  [16])*ptr_05,local_268);
                    auVar53 = pblendvb(auVar54,auVar53,auVar60);
                    iVar24 = 6;
                    do {
                      auVar156._0_8_ = auVar112._0_8_ << 0x10;
                      auVar156._8_8_ = auVar112._8_8_ << 0x10 | auVar112._0_8_ >> 0x30;
                      auVar93._0_8_ = auVar92._0_8_ << 0x10;
                      auVar93._8_8_ = auVar92._8_8_ << 0x10 | auVar92._0_8_ >> 0x30;
                      auVar54 = paddsw(auVar93,auVar85);
                      sVar48 = auVar92._0_2_;
                      sVar70 = auVar54._0_2_;
                      auVar61._0_2_ = -(ushort)(sVar70 < sVar48);
                      sVar49 = auVar92._2_2_;
                      sVar71 = auVar54._2_2_;
                      auVar61._2_2_ = -(ushort)(sVar71 < sVar49);
                      sVar64 = auVar92._4_2_;
                      sVar72 = auVar54._4_2_;
                      auVar61._4_2_ = -(ushort)(sVar72 < sVar64);
                      sVar65 = auVar92._6_2_;
                      sVar73 = auVar54._6_2_;
                      auVar61._6_2_ = -(ushort)(sVar73 < sVar65);
                      sVar66 = auVar92._8_2_;
                      sVar74 = auVar54._8_2_;
                      auVar61._8_2_ = -(ushort)(sVar74 < sVar66);
                      sVar67 = auVar92._10_2_;
                      sVar75 = auVar54._10_2_;
                      auVar61._10_2_ = -(ushort)(sVar75 < sVar67);
                      sVar68 = auVar92._12_2_;
                      sVar76 = auVar54._12_2_;
                      sVar69 = auVar92._14_2_;
                      auVar61._12_2_ = -(ushort)(sVar76 < sVar68);
                      sVar77 = auVar54._14_2_;
                      auVar61._14_2_ = -(ushort)(sVar77 < sVar69);
                      auVar112 = pblendvb(auVar156,auVar112,auVar61);
                      auVar152._0_8_ = auVar55._0_8_ << 0x10;
                      auVar152._8_8_ = auVar55._8_8_ << 0x10 | auVar55._0_8_ >> 0x30;
                      auVar144._0_8_ = auVar53._0_8_ << 0x10;
                      auVar144._8_8_ = auVar53._8_8_ << 0x10 | auVar53._0_8_ >> 0x30;
                      auVar54 = paddsw(auVar144,auVar79);
                      uVar129 = (ushort)(sVar73 < sVar65) * sVar65 |
                                (ushort)(sVar73 >= sVar65) * sVar73;
                      auVar92._0_8_ =
                           CONCAT26(uVar129,CONCAT24((ushort)(sVar72 < sVar64) * sVar64 |
                                                     (ushort)(sVar72 >= sVar64) * sVar72,
                                                     CONCAT22((ushort)(sVar71 < sVar49) * sVar49 |
                                                              (ushort)(sVar71 >= sVar49) * sVar71,
                                                              (ushort)(sVar70 < sVar48) * sVar48 |
                                                              (ushort)(sVar70 >= sVar48) * sVar70)))
                      ;
                      auVar92._8_2_ =
                           (ushort)(sVar74 < sVar66) * sVar66 | (ushort)(sVar74 >= sVar66) * sVar74;
                      auVar92._10_2_ =
                           (ushort)(sVar75 < sVar67) * sVar67 | (ushort)(sVar75 >= sVar67) * sVar75;
                      auVar92._12_2_ =
                           (ushort)(sVar76 < sVar68) * sVar68 | (ushort)(sVar76 >= sVar68) * sVar76;
                      auVar92._14_2_ =
                           (ushort)(sVar77 < sVar69) * sVar69 | (ushort)(sVar77 >= sVar69) * sVar77;
                      auVar55 = pblendvb(auVar152,auVar55,auVar61);
                      auVar53 = pblendvb(auVar54,auVar53,auVar61);
                      iVar24 = iVar24 + -1;
                    } while (iVar24 != 0);
                    auVar94._0_8_ = auVar92._0_8_ << 0x10;
                    auVar94._8_8_ = auVar92._8_8_ << 0x10 | (ulong)uVar129;
                    auVar95 = paddsw(auVar94,ZEXT416((uint)c[1] & 0xffff));
                    sVar48 = auVar95._0_2_;
                    auVar62._0_2_ = -(ushort)((short)uVar127 < sVar48);
                    sVar49 = auVar95._2_2_;
                    auVar62._2_2_ = -(ushort)((short)uVar115 < sVar49);
                    sVar64 = auVar95._4_2_;
                    auVar62._4_2_ = -(ushort)((short)uVar118 < sVar64);
                    sVar65 = auVar95._6_2_;
                    auVar62._6_2_ = -(ushort)((short)uVar121 < sVar65);
                    sVar66 = auVar95._8_2_;
                    auVar62._8_2_ = -(ushort)((short)uVar124 < sVar66);
                    sVar67 = auVar95._10_2_;
                    auVar62._10_2_ = -(ushort)((short)auVar80._8_2_ < sVar67);
                    sVar68 = auVar95._12_2_;
                    sVar69 = auVar95._14_2_;
                    auVar62._12_2_ = -(ushort)((short)auVar80._10_2_ < sVar68);
                    auVar62._14_2_ = -(ushort)((short)auVar80._12_2_ < sVar69);
                    auVar157._0_8_ = auVar112._0_8_ << 0x10;
                    auVar157._8_8_ = auVar112._8_8_ << 0x10 | auVar112._0_8_ >> 0x30;
                    auVar112 = pblendvb(local_278,auVar157,auVar62);
                    auVar153._0_8_ = auVar55._0_8_ << 0x10;
                    auVar153._8_8_ = auVar55._8_8_ << 0x10 | auVar55._0_8_ >> 0x30;
                    auVar55 = pblendvb(local_288,auVar153,auVar62);
                    auVar82._0_2_ =
                         (ushort)((short)uVar127 < sVar48) * sVar48 |
                         ((short)uVar127 >= sVar48) * uVar127;
                    auVar82._2_2_ =
                         (ushort)((short)uVar115 < sVar49) * sVar49 |
                         ((short)uVar115 >= sVar49) * uVar115;
                    auVar82._4_2_ =
                         (ushort)((short)uVar118 < sVar64) * sVar64 |
                         ((short)uVar118 >= sVar64) * uVar118;
                    auVar82._6_2_ =
                         (ushort)((short)uVar121 < sVar65) * sVar65 |
                         ((short)uVar121 >= sVar65) * uVar121;
                    auVar82._8_2_ =
                         (ushort)((short)uVar124 < sVar66) * sVar66 |
                         ((short)uVar124 >= sVar66) * uVar124;
                    auVar82._10_2_ =
                         (ushort)((short)auVar80._8_2_ < sVar67) * sVar67 |
                         ((short)auVar80._8_2_ >= sVar67) * auVar80._8_2_;
                    auVar82._12_2_ =
                         (ushort)((short)auVar80._10_2_ < sVar68) * sVar68 |
                         ((short)auVar80._10_2_ >= sVar68) * auVar80._10_2_;
                    auVar82._14_2_ =
                         (ushort)((short)auVar80._12_2_ < sVar69) * sVar69 |
                         ((short)auVar80._12_2_ >= sVar69) * auVar80._12_2_;
                    auVar145._0_8_ = auVar53._0_8_ << 0x10;
                    auVar145._8_8_ = auVar53._8_8_ << 0x10 | auVar53._0_8_ >> 0x30;
                    auVar53 = pblendvb(local_268,auVar145,auVar62);
                    lVar47 = 0;
                    auVar18._4_4_ = uVar51;
                    auVar18._0_4_ = uVar51;
                    auVar18._8_4_ = uVar51;
                    auVar18._12_4_ = uVar51;
                    auVar54 = pmovsxbw(auVar79,0x101010101010101);
                    lVar33 = local_218;
                    do {
                      auVar142 = psubsw(auVar82,auVar56);
                      auVar89 = psubsw(auVar95,auVar18);
                      sVar48 = auVar142._0_2_;
                      sVar70 = auVar89._0_2_;
                      auVar83._0_2_ = -(ushort)(sVar70 < sVar48);
                      sVar49 = auVar142._2_2_;
                      sVar71 = auVar89._2_2_;
                      auVar83._2_2_ = -(ushort)(sVar71 < sVar49);
                      sVar64 = auVar142._4_2_;
                      sVar72 = auVar89._4_2_;
                      auVar83._4_2_ = -(ushort)(sVar72 < sVar64);
                      sVar65 = auVar142._6_2_;
                      sVar73 = auVar89._6_2_;
                      auVar83._6_2_ = -(ushort)(sVar73 < sVar65);
                      sVar66 = auVar142._8_2_;
                      sVar74 = auVar89._8_2_;
                      auVar83._8_2_ = -(ushort)(sVar74 < sVar66);
                      sVar67 = auVar142._10_2_;
                      sVar75 = auVar89._10_2_;
                      auVar83._10_2_ = -(ushort)(sVar75 < sVar67);
                      sVar68 = auVar142._12_2_;
                      sVar76 = auVar89._12_2_;
                      sVar69 = auVar142._14_2_;
                      auVar83._12_2_ = -(ushort)(sVar76 < sVar68);
                      sVar77 = auVar89._14_2_;
                      auVar83._14_2_ = -(ushort)(sVar77 < sVar69);
                      auVar157 = pblendvb(auVar157,auVar112,auVar83);
                      auVar153 = pblendvb(auVar153,auVar55,auVar83);
                      puVar1 = (ushort *)((long)*ptr + lVar47);
                      uVar115 = *puVar1;
                      uVar118 = puVar1[1];
                      uVar121 = puVar1[2];
                      uVar124 = puVar1[3];
                      uVar127 = puVar1[4];
                      uVar129 = puVar1[5];
                      uVar131 = puVar1[6];
                      uVar133 = puVar1[7];
                      auVar53 = pblendvb(auVar145,auVar53,auVar83);
                      auVar95._0_2_ =
                           (ushort)(sVar48 < sVar70) * sVar70 | (ushort)(sVar48 >= sVar70) * sVar48;
                      auVar95._2_2_ =
                           (ushort)(sVar49 < sVar71) * sVar71 | (ushort)(sVar49 >= sVar71) * sVar49;
                      auVar95._4_2_ =
                           (ushort)(sVar64 < sVar72) * sVar72 | (ushort)(sVar64 >= sVar72) * sVar64;
                      auVar95._6_2_ =
                           (ushort)(sVar65 < sVar73) * sVar73 | (ushort)(sVar65 >= sVar73) * sVar65;
                      auVar95._8_2_ =
                           (ushort)(sVar66 < sVar74) * sVar74 | (ushort)(sVar66 >= sVar74) * sVar66;
                      auVar95._10_2_ =
                           (ushort)(sVar67 < sVar75) * sVar75 | (ushort)(sVar67 >= sVar75) * sVar67;
                      auVar95._12_2_ =
                           (ushort)(sVar68 < sVar76) * sVar76 | (ushort)(sVar68 >= sVar76) * sVar68;
                      auVar95._14_2_ =
                           (ushort)(sVar69 < sVar77) * sVar77 | (ushort)(sVar69 >= sVar77) * sVar69;
                      psVar2 = (short *)((long)*b + lVar47);
                      sVar48 = *psVar2;
                      sVar49 = psVar2[1];
                      sVar64 = psVar2[2];
                      sVar65 = psVar2[3];
                      sVar66 = psVar2[4];
                      sVar67 = psVar2[5];
                      sVar68 = psVar2[6];
                      sVar69 = psVar2[7];
                      uVar88 = (sVar48 < (short)uVar115) * uVar115 |
                               (ushort)(sVar48 >= (short)uVar115) * sVar48;
                      uVar97 = (sVar49 < (short)uVar118) * uVar118 |
                               (ushort)(sVar49 >= (short)uVar118) * sVar49;
                      uVar98 = (sVar64 < (short)uVar121) * uVar121 |
                               (ushort)(sVar64 >= (short)uVar121) * sVar64;
                      uVar99 = (sVar65 < (short)uVar124) * uVar124 |
                               (ushort)(sVar65 >= (short)uVar124) * sVar65;
                      uVar100 = (sVar66 < (short)uVar127) * uVar127 |
                                (ushort)(sVar66 >= (short)uVar127) * sVar66;
                      uVar101 = (sVar67 < (short)uVar129) * uVar129 |
                                (ushort)(sVar67 >= (short)uVar129) * sVar67;
                      uVar102 = (sVar68 < (short)uVar131) * uVar131 |
                                (ushort)(sVar68 >= (short)uVar131) * sVar68;
                      uVar103 = (sVar69 < (short)uVar133) * uVar133 |
                                (ushort)(sVar69 >= (short)uVar133) * sVar69;
                      auVar82._0_2_ =
                           ((short)uVar88 < (short)auVar95._0_2_) * auVar95._0_2_ |
                           ((short)uVar88 >= (short)auVar95._0_2_) * uVar88;
                      auVar82._2_2_ =
                           ((short)uVar97 < (short)auVar95._2_2_) * auVar95._2_2_ |
                           ((short)uVar97 >= (short)auVar95._2_2_) * uVar97;
                      auVar82._4_2_ =
                           ((short)uVar98 < (short)auVar95._4_2_) * auVar95._4_2_ |
                           ((short)uVar98 >= (short)auVar95._4_2_) * uVar98;
                      auVar82._6_2_ =
                           ((short)uVar99 < (short)auVar95._6_2_) * auVar95._6_2_ |
                           ((short)uVar99 >= (short)auVar95._6_2_) * uVar99;
                      auVar82._8_2_ =
                           ((short)uVar100 < (short)auVar95._8_2_) * auVar95._8_2_ |
                           ((short)uVar100 >= (short)auVar95._8_2_) * uVar100;
                      auVar82._10_2_ =
                           ((short)uVar101 < (short)auVar95._10_2_) * auVar95._10_2_ |
                           ((short)uVar101 >= (short)auVar95._10_2_) * uVar101;
                      auVar82._12_2_ =
                           ((short)uVar102 < (short)auVar95._12_2_) * auVar95._12_2_ |
                           ((short)uVar102 >= (short)auVar95._12_2_) * uVar102;
                      auVar82._14_2_ =
                           ((short)uVar103 < (short)auVar95._14_2_) * auVar95._14_2_ |
                           ((short)uVar103 >= (short)auVar95._14_2_) * uVar103;
                      auVar96._0_2_ = -(ushort)((short)auVar95._0_2_ < (short)uVar88);
                      auVar96._2_2_ = -(ushort)((short)auVar95._2_2_ < (short)uVar97);
                      auVar96._4_2_ = -(ushort)((short)auVar95._4_2_ < (short)uVar98);
                      auVar96._6_2_ = -(ushort)((short)auVar95._6_2_ < (short)uVar99);
                      auVar96._8_2_ = -(ushort)((short)auVar95._8_2_ < (short)uVar100);
                      auVar96._10_2_ = -(ushort)((short)auVar95._10_2_ < (short)uVar101);
                      auVar96._12_2_ = -(ushort)((short)auVar95._12_2_ < (short)uVar102);
                      auVar96._14_2_ = -(ushort)((short)auVar95._14_2_ < (short)uVar103);
                      auVar87._0_2_ = -(ushort)(uVar115 == auVar82._0_2_);
                      auVar87._2_2_ = -(ushort)(uVar118 == auVar82._2_2_);
                      auVar87._4_2_ = -(ushort)(uVar121 == auVar82._4_2_);
                      auVar87._6_2_ = -(ushort)(uVar124 == auVar82._6_2_);
                      auVar87._8_2_ = -(ushort)(uVar127 == auVar82._8_2_);
                      auVar87._10_2_ = -(ushort)(uVar129 == auVar82._10_2_);
                      auVar87._12_2_ = -(ushort)(uVar131 == auVar82._12_2_);
                      auVar87._14_2_ = -(ushort)(uVar133 == auVar82._14_2_);
                      auVar55 = pblendvb(auVar157,*(undefined1 (*) [16])((long)*b_00 + lVar47),
                                         auVar96);
                      auVar112 = pblendvb(auVar55,*(undefined1 (*) [16])((long)*b_03 + lVar47),
                                          auVar87);
                      auVar145 = paddsw(auVar53,auVar54);
                      auVar53 = pblendvb(auVar153,*(undefined1 (*) [16])((long)*b_01 + lVar47),
                                         auVar96);
                      auVar55 = pblendvb(auVar53,*(undefined1 (*) [16])((long)*b_04 + lVar47),
                                         auVar87);
                      auVar53 = pblendvb(auVar145,*(undefined1 (*) [16])((long)*b_02 + lVar47),
                                         auVar96);
                      auVar53 = pblendvb(auVar53,*(undefined1 (*) [16])((long)*b_05 + lVar47),
                                         auVar87);
                      *(undefined1 (*) [16])((long)*ptr + lVar47) = auVar82;
                      *(undefined1 (*) [16])((long)*b_03 + lVar47) = auVar112;
                      *(undefined1 (*) [16])((long)*b_04 + lVar47) = auVar55;
                      *(undefined1 (*) [16])((long)*b_05 + lVar47) = auVar53;
                      lVar29 = *((ppVar25->field_4).trace)->trace_del_table;
                      *(int *)(lVar29 + lVar33) = (int)(short)auVar82._0_2_;
                      lVar29 = lVar29 + lVar33;
                      *(int *)(lVar27 + lVar29) = (int)(short)auVar82._2_2_;
                      *(int *)(lVar36 + lVar29) = (int)(short)auVar82._4_2_;
                      *(int *)(lVar40 + lVar29) = (int)(short)auVar82._6_2_;
                      *(int *)(lVar45 + lVar29) = (int)(short)auVar82._8_2_;
                      *(int *)(lVar41 + lVar29) = (int)(short)auVar82._10_2_;
                      *(int *)(lVar44 + lVar29) = (int)(short)auVar82._12_2_;
                      *(int *)(lVar12 + lVar29) = (int)(short)auVar82._14_2_;
                      lVar29 = *(long *)((long)((ppVar25->field_4).trace)->trace_del_table + 8);
                      sVar46 = auVar112._0_2_;
                      sVar48 = auVar112._2_2_;
                      *(int *)(lVar29 + lVar33) = (int)sVar46;
                      sVar49 = auVar112._4_2_;
                      lVar29 = lVar29 + lVar33;
                      *(int *)(lVar27 + lVar29) = (int)sVar48;
                      sVar64 = auVar112._6_2_;
                      *(int *)(lVar36 + lVar29) = (int)sVar49;
                      sVar65 = auVar112._8_2_;
                      *(int *)(lVar40 + lVar29) = (int)sVar64;
                      sVar66 = auVar112._10_2_;
                      *(int *)(lVar45 + lVar29) = (int)sVar65;
                      sVar67 = auVar112._12_2_;
                      *(int *)(lVar41 + lVar29) = (int)sVar66;
                      sVar68 = auVar112._14_2_;
                      *(int *)(lVar44 + lVar29) = (int)sVar67;
                      *(int *)(lVar12 + lVar29) = (int)sVar68;
                      lVar29 = *(long *)((long)((ppVar25->field_4).trace)->trace_del_table + 0x10);
                      sVar30 = auVar55._0_2_;
                      *(int *)(lVar29 + lVar33) = (int)sVar30;
                      sVar69 = auVar55._2_2_;
                      lVar29 = lVar29 + lVar33;
                      *(int *)(lVar27 + lVar29) = (int)sVar69;
                      sVar70 = auVar55._4_2_;
                      *(int *)(lVar36 + lVar29) = (int)sVar70;
                      sVar71 = auVar55._6_2_;
                      *(int *)(lVar40 + lVar29) = (int)sVar71;
                      sVar72 = auVar55._8_2_;
                      *(int *)(lVar45 + lVar29) = (int)sVar72;
                      sVar73 = auVar55._10_2_;
                      *(int *)(lVar41 + lVar29) = (int)sVar73;
                      sVar74 = auVar55._12_2_;
                      *(int *)(lVar44 + lVar29) = (int)sVar74;
                      sVar75 = auVar55._14_2_;
                      *(int *)(lVar12 + lVar29) = (int)sVar75;
                      lVar29 = *(long *)((long)((ppVar25->field_4).trace)->trace_del_table + 0x18);
                      sVar31 = auVar53._0_2_;
                      *(int *)(lVar29 + lVar33) = (int)sVar31;
                      sVar76 = auVar53._2_2_;
                      lVar29 = lVar29 + lVar33;
                      *(int *)(lVar27 + lVar29) = (int)sVar76;
                      sVar77 = auVar53._4_2_;
                      *(int *)(lVar36 + lVar29) = (int)sVar77;
                      sVar114 = auVar53._6_2_;
                      *(int *)(lVar40 + lVar29) = (int)sVar114;
                      sVar117 = auVar53._8_2_;
                      *(int *)(lVar45 + lVar29) = (int)sVar117;
                      sVar120 = auVar53._10_2_;
                      *(int *)(lVar41 + lVar29) = (int)sVar120;
                      sVar123 = auVar53._12_2_;
                      *(int *)(lVar44 + lVar29) = (int)sVar123;
                      sVar126 = auVar53._14_2_;
                      *(int *)(lVar12 + lVar29) = (int)sVar126;
                      uVar116 = ((short)auVar82._0_2_ < (short)uVar116) * auVar82._0_2_ |
                                ((short)auVar82._0_2_ >= (short)uVar116) * uVar116;
                      uVar119 = ((short)auVar82._2_2_ < (short)uVar119) * auVar82._2_2_ |
                                ((short)auVar82._2_2_ >= (short)uVar119) * uVar119;
                      uVar122 = ((short)auVar82._4_2_ < (short)uVar122) * auVar82._4_2_ |
                                ((short)auVar82._4_2_ >= (short)uVar122) * uVar122;
                      uVar125 = ((short)auVar82._6_2_ < (short)uVar125) * auVar82._6_2_ |
                                ((short)auVar82._6_2_ >= (short)uVar125) * uVar125;
                      uVar128 = ((short)auVar82._8_2_ < (short)uVar128) * auVar82._8_2_ |
                                ((short)auVar82._8_2_ >= (short)uVar128) * uVar128;
                      uVar130 = ((short)auVar82._10_2_ < (short)uVar130) * auVar82._10_2_ |
                                ((short)auVar82._10_2_ >= (short)uVar130) * uVar130;
                      uVar132 = ((short)auVar82._12_2_ < (short)uVar132) * auVar82._12_2_ |
                                ((short)auVar82._12_2_ >= (short)uVar132) * uVar132;
                      uVar134 = ((short)auVar82._14_2_ < (short)uVar134) * auVar82._14_2_ |
                                ((short)auVar82._14_2_ >= (short)uVar134) * uVar134;
                      sVar107 = auVar108._0_2_;
                      uVar115 = (sVar107 < (short)auVar82._0_2_) * auVar82._0_2_ |
                                (ushort)(sVar107 >= (short)auVar82._0_2_) * sVar107;
                      sVar107 = auVar108._2_2_;
                      uVar118 = (sVar107 < (short)auVar82._2_2_) * auVar82._2_2_ |
                                (ushort)(sVar107 >= (short)auVar82._2_2_) * sVar107;
                      sVar107 = auVar108._4_2_;
                      uVar121 = (sVar107 < (short)auVar82._4_2_) * auVar82._4_2_ |
                                (ushort)(sVar107 >= (short)auVar82._4_2_) * sVar107;
                      sVar107 = auVar108._6_2_;
                      uVar124 = (sVar107 < (short)auVar82._6_2_) * auVar82._6_2_ |
                                (ushort)(sVar107 >= (short)auVar82._6_2_) * sVar107;
                      sVar107 = auVar108._8_2_;
                      uVar127 = (sVar107 < (short)auVar82._8_2_) * auVar82._8_2_ |
                                (ushort)(sVar107 >= (short)auVar82._8_2_) * sVar107;
                      sVar107 = auVar108._10_2_;
                      uVar129 = (sVar107 < (short)auVar82._10_2_) * auVar82._10_2_ |
                                (ushort)(sVar107 >= (short)auVar82._10_2_) * sVar107;
                      sVar107 = auVar108._12_2_;
                      sVar110 = auVar108._14_2_;
                      uVar131 = (sVar107 < (short)auVar82._12_2_) * auVar82._12_2_ |
                                (ushort)(sVar107 >= (short)auVar82._12_2_) * sVar107;
                      uVar133 = (sVar110 < (short)auVar82._14_2_) * auVar82._14_2_ |
                                (ushort)(sVar110 >= (short)auVar82._14_2_) * sVar110;
                      uVar115 = (ushort)((short)uVar115 < sVar46) * sVar46 |
                                ((short)uVar115 >= sVar46) * uVar115;
                      uVar118 = (ushort)((short)uVar118 < sVar48) * sVar48 |
                                ((short)uVar118 >= sVar48) * uVar118;
                      uVar121 = (ushort)((short)uVar121 < sVar49) * sVar49 |
                                ((short)uVar121 >= sVar49) * uVar121;
                      uVar124 = (ushort)((short)uVar124 < sVar64) * sVar64 |
                                ((short)uVar124 >= sVar64) * uVar124;
                      uVar127 = (ushort)((short)uVar127 < sVar65) * sVar65 |
                                ((short)uVar127 >= sVar65) * uVar127;
                      uVar129 = (ushort)((short)uVar129 < sVar66) * sVar66 |
                                ((short)uVar129 >= sVar66) * uVar129;
                      uVar131 = (ushort)((short)uVar131 < sVar67) * sVar67 |
                                ((short)uVar131 >= sVar67) * uVar131;
                      uVar133 = (ushort)((short)uVar133 < sVar68) * sVar68 |
                                ((short)uVar133 >= sVar68) * uVar133;
                      uVar88 = (ushort)(sVar30 < sVar31) * sVar31 |
                               (ushort)(sVar30 >= sVar31) * sVar30;
                      uVar97 = (ushort)(sVar69 < sVar76) * sVar76 |
                               (ushort)(sVar69 >= sVar76) * sVar69;
                      uVar98 = (ushort)(sVar70 < sVar77) * sVar77 |
                               (ushort)(sVar70 >= sVar77) * sVar70;
                      uVar99 = (ushort)(sVar71 < sVar114) * sVar114 |
                               (ushort)(sVar71 >= sVar114) * sVar71;
                      uVar100 = (ushort)(sVar72 < sVar117) * sVar117 |
                                (ushort)(sVar72 >= sVar117) * sVar72;
                      uVar101 = (ushort)(sVar73 < sVar120) * sVar120 |
                                (ushort)(sVar73 >= sVar120) * sVar73;
                      uVar102 = (ushort)(sVar74 < sVar123) * sVar123 |
                                (ushort)(sVar74 >= sVar123) * sVar74;
                      uVar103 = (ushort)(sVar75 < sVar126) * sVar126 |
                                (ushort)(sVar75 >= sVar126) * sVar75;
                      auVar108._0_2_ =
                           ((short)uVar88 < (short)uVar115) * uVar115 |
                           ((short)uVar88 >= (short)uVar115) * uVar88;
                      auVar108._2_2_ =
                           ((short)uVar97 < (short)uVar118) * uVar118 |
                           ((short)uVar97 >= (short)uVar118) * uVar97;
                      auVar108._4_2_ =
                           ((short)uVar98 < (short)uVar121) * uVar121 |
                           ((short)uVar98 >= (short)uVar121) * uVar98;
                      auVar108._6_2_ =
                           ((short)uVar99 < (short)uVar124) * uVar124 |
                           ((short)uVar99 >= (short)uVar124) * uVar99;
                      auVar108._8_2_ =
                           ((short)uVar100 < (short)uVar127) * uVar127 |
                           ((short)uVar100 >= (short)uVar127) * uVar100;
                      auVar108._10_2_ =
                           ((short)uVar101 < (short)uVar129) * uVar129 |
                           ((short)uVar101 >= (short)uVar129) * uVar101;
                      auVar108._12_2_ =
                           ((short)uVar102 < (short)uVar131) * uVar131 |
                           ((short)uVar102 >= (short)uVar131) * uVar102;
                      auVar108._14_2_ =
                           ((short)uVar103 < (short)uVar133) * uVar133 |
                           ((short)uVar103 >= (short)uVar133) * uVar103;
                      lVar47 = lVar47 + 0x10;
                      lVar33 = lVar33 + uVar38 * 4;
                    } while (uVar32 << 4 != lVar47);
                    sVar49 = (short)(*palVar42)[0];
                    sVar64 = *(short *)((long)*palVar42 + 2);
                    sVar65 = *(short *)((long)*palVar42 + 4);
                    sVar66 = *(short *)((long)*palVar42 + 6);
                    sVar67 = (short)(*palVar42)[1];
                    sVar68 = *(short *)((long)*palVar42 + 10);
                    sVar69 = *(short *)((long)*palVar42 + 0xc);
                    sVar70 = *(short *)((long)*palVar42 + 0xe);
                    local_b8 = auVar113._0_2_;
                    sStack_b6 = auVar113._2_2_;
                    sStack_b4 = auVar113._4_2_;
                    sStack_b2 = auVar113._6_2_;
                    sStack_b0 = auVar113._8_2_;
                    sStack_ae = auVar113._10_2_;
                    sStack_ac = auVar113._12_2_;
                    sStack_aa = auVar113._14_2_;
                    auVar63._0_2_ = -(ushort)(local_b8 < sVar49);
                    auVar63._2_2_ = -(ushort)(sStack_b6 < sVar64);
                    auVar63._4_2_ = -(ushort)(sStack_b4 < sVar65);
                    auVar63._6_2_ = -(ushort)(sStack_b2 < sVar66);
                    auVar63._8_2_ = -(ushort)(sStack_b0 < sVar67);
                    auVar63._10_2_ = -(ushort)(sStack_ae < sVar68);
                    auVar63._12_2_ = -(ushort)(sStack_ac < sVar69);
                    auVar63._14_2_ = -(ushort)(sStack_aa < sVar70);
                    auVar106 = pblendvb(auVar106,(undefined1  [16])b_03[uVar52],auVar63);
                    auVar146 = pblendvb(auVar146,(undefined1  [16])b_04[uVar52],auVar63);
                    auVar104 = pblendvb(auVar104,(undefined1  [16])b_05[uVar52],auVar63);
                    sVar48 = auVar104._14_2_;
                    auVar16._2_2_ = -(ushort)(sStack_1e6 == 6);
                    auVar16._0_2_ = -(ushort)(local_1e8 == 7);
                    auVar16._4_2_ = -(ushort)(local_1e8 == 5);
                    auVar16._6_2_ = -(ushort)(sStack_1e6 == 4);
                    auVar16._8_2_ = -(ushort)(local_1e8 == 3);
                    auVar16._10_2_ = -(ushort)(sStack_1e6 == 2);
                    auVar16._12_2_ = -(ushort)(local_1e8 == 1);
                    auVar16._14_2_ = -(ushort)(sStack_1e6 == 0);
                    auVar63 = auVar63 & auVar16;
                    local_208 = (int)uVar37;
                    if ((((((((((((((((auVar63 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar63 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar63 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar63 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar63 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar63 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar63 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar63 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar63 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar63 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar63 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar63 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar63 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar63[0xf] < '\0') {
                      local_334 = local_208;
                    }
                    auVar113._0_2_ =
                         (ushort)(local_b8 < sVar49) * sVar49 |
                         (ushort)(local_b8 >= sVar49) * local_b8;
                    auVar113._2_2_ =
                         (ushort)(sStack_b6 < sVar64) * sVar64 |
                         (ushort)(sStack_b6 >= sVar64) * sStack_b6;
                    auVar113._4_2_ =
                         (ushort)(sStack_b4 < sVar65) * sVar65 |
                         (ushort)(sStack_b4 >= sVar65) * sStack_b4;
                    auVar113._6_2_ =
                         (ushort)(sStack_b2 < sVar66) * sVar66 |
                         (ushort)(sStack_b2 >= sVar66) * sStack_b2;
                    auVar113._8_2_ =
                         (ushort)(sStack_b0 < sVar67) * sVar67 |
                         (ushort)(sStack_b0 >= sVar67) * sStack_b0;
                    auVar113._10_2_ =
                         (ushort)(sStack_ae < sVar68) * sVar68 |
                         (ushort)(sStack_ae >= sVar68) * sStack_ae;
                    auVar113._12_2_ =
                         (ushort)(sStack_ac < sVar69) * sVar69 |
                         (ushort)(sStack_ac >= sVar69) * sStack_ac;
                    auVar113._14_2_ =
                         (ushort)(sStack_aa < sVar70) * sVar70 |
                         (ushort)(sStack_aa >= sVar70) * sStack_aa;
                    local_218 = local_218 + 4;
                    uVar37 = uVar111;
                  } while (uVar111 != uVar38);
                  if (s2_end == 0) {
                    sVar49 = 0;
                    sVar64 = 0;
                    sVar48 = 0;
                  }
                  else {
                    if (iVar20 < 7) {
                      iVar24 = 0;
                      do {
                        lVar27 = auVar113._8_8_;
                        uVar38 = auVar113._0_8_;
                        auVar113._0_8_ = uVar38 << 0x10;
                        auVar113._8_8_ = lVar27 << 0x10 | uVar38 >> 0x30;
                        lVar27 = auVar106._8_8_;
                        uVar38 = auVar106._0_8_;
                        auVar106._0_8_ = uVar38 << 0x10;
                        auVar106._8_8_ = lVar27 << 0x10 | uVar38 >> 0x30;
                        lVar27 = auVar146._8_8_;
                        uVar38 = auVar146._0_8_;
                        auVar146._0_8_ = uVar38 << 0x10;
                        auVar146._8_8_ = lVar27 << 0x10 | uVar38 >> 0x30;
                        auVar79._0_8_ = auVar104._0_8_ << 0x10;
                        auVar79._8_8_ = auVar104._8_8_ << 0x10 | auVar104._0_8_ >> 0x30;
                        sVar48 = auVar104._12_2_;
                        iVar24 = iVar24 + 1;
                        auVar104 = auVar79;
                      } while (iVar24 < (int)uVar23);
                    }
                    c[1]._0_4_ = (uint)(ushort)(auVar113._8_8_ >> 0x30);
                    sVar49 = (short)(auVar106._8_8_ >> 0x30);
                    sVar64 = (short)(auVar146._8_8_ >> 0x30);
                  }
                  sVar65 = (short)(uint)c[1];
                  uVar28 = uVar43;
                  if ((s1_end != 0) && ((uVar84 & 0x7ffffff8) != 0)) {
                    uVar38 = 0;
                    do {
                      uVar39 = ((uint)uVar38 & 7) * uVar21 + ((uint)(uVar38 >> 3) & 0x1fffffff);
                      if ((int)uVar39 < (int)uVar3) {
                        uVar115 = *(ushort *)((long)*ptr + uVar38 * 2);
                        uVar19 = (uint)uVar115;
                        if (((short)(ushort)(uint)c[1] < (short)uVar115) ||
                           (((uVar115 == (ushort)(uint)c[1] && (local_334 == iVar22)) &&
                            (uVar19 = (uint)c[1], (int)uVar39 < (int)uVar28)))) {
                          c[1]._0_4_ = uVar19;
                          sVar49 = *(short *)((long)*b_03 + uVar38 * 2);
                          sVar64 = *(short *)((long)*b_04 + uVar38 * 2);
                          sVar48 = *(short *)((long)*b_05 + uVar38 * 2);
                          local_334 = iVar22;
                          uVar28 = uVar39;
                        }
                      }
                      sVar65 = (short)(uint)c[1];
                      uVar38 = uVar38 + 1;
                    } while ((uVar21 & 0xfffffff) << 3 != (int)uVar38);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    uVar38 = ptr[uVar52][1];
                    uVar37 = b_03[uVar52][1];
                    uVar84 = b_04[uVar52][1];
                    uVar32 = b_05[uVar52][1];
                    if (iVar20 < 7) {
                      iVar24 = 0;
                      auVar146._8_8_ = ptr[uVar52][0];
                      uVar26 = b_03[uVar52][0];
                      auVar106._8_8_ = b_04[uVar52][0];
                      uVar52 = b_05[uVar52][0];
                      do {
                        uVar38 = uVar38 << 0x10 | auVar146._8_8_ >> 0x30;
                        uVar37 = uVar37 << 0x10 | uVar26 >> 0x30;
                        uVar84 = uVar84 << 0x10 | auVar106._8_8_ >> 0x30;
                        uVar32 = uVar32 << 0x10 | uVar52 >> 0x30;
                        iVar24 = iVar24 + 1;
                        auVar146._8_8_ = auVar146._8_8_ << 0x10;
                        uVar26 = uVar26 << 0x10;
                        auVar106._8_8_ = auVar106._8_8_ << 0x10;
                        uVar52 = uVar52 << 0x10;
                      } while (iVar24 < (int)uVar23);
                    }
                    sVar65 = (short)(uVar38 >> 0x30);
                    sVar49 = (short)(uVar37 >> 0x30);
                    sVar64 = (short)(uVar84 >> 0x30);
                    sVar48 = (short)(uVar32 >> 0x30);
                    uVar28 = uVar43;
                    local_334 = iVar22;
                  }
                  auVar85._0_2_ = -(ushort)((short)uVar116 < local_1f8);
                  auVar85._2_2_ = -(ushort)((short)uVar119 < sStack_1f6);
                  auVar85._4_2_ = -(ushort)((short)uVar122 < local_1f8);
                  auVar85._6_2_ = -(ushort)((short)uVar125 < sStack_1f6);
                  auVar85._8_2_ = -(ushort)((short)uVar128 < local_1f8);
                  auVar85._10_2_ = -(ushort)((short)uVar130 < sStack_1f6);
                  auVar85._12_2_ = -(ushort)((short)uVar132 < local_1f8);
                  auVar85._14_2_ = -(ushort)((short)uVar134 < sStack_1f6);
                  auVar109._0_2_ = -(ushort)((short)local_f8 < (short)auVar108._0_2_);
                  auVar109._2_2_ = -(ushort)((short)uStack_f6 < (short)auVar108._2_2_);
                  auVar109._4_2_ = -(ushort)((short)local_f8 < (short)auVar108._4_2_);
                  auVar109._6_2_ = -(ushort)((short)uStack_f6 < (short)auVar108._6_2_);
                  auVar109._8_2_ = -(ushort)((short)local_f8 < (short)auVar108._8_2_);
                  auVar109._10_2_ = -(ushort)((short)uStack_f6 < (short)auVar108._10_2_);
                  auVar109._12_2_ = -(ushort)((short)local_f8 < (short)auVar108._12_2_);
                  auVar109._14_2_ = -(ushort)((short)uStack_f6 < (short)auVar108._14_2_);
                  auVar109 = auVar109 | auVar85;
                  if ((((((((((((((((auVar109 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar109 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar109 >> 0x17 & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                                 (auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || (auVar109 >> 0x27 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                               (auVar109 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar109 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                              ) || (auVar109 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                            (auVar109 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar109 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar109 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar109 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar109 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar109 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar109[0xf] < '\0') {
                    *(byte *)&ppVar25->flag = (byte)ppVar25->flag | 0x40;
                    sVar65 = 0;
                    sVar49 = 0;
                    sVar64 = 0;
                    sVar48 = 0;
                    local_334 = 0;
                    uVar28 = 0;
                  }
                  ppVar25->score = (int)sVar65;
                  ppVar25->end_query = uVar28;
                  ppVar25->end_ref = local_334;
                  *(int *)(ppVar25->field_4).extra = (int)sVar49;
                  ((ppVar25->field_4).stats)->similar = (int)sVar64;
                  ((ppVar25->field_4).stats)->length = (int)sVar48;
                  parasail_free(ptr_06);
                  parasail_free(ptr_05);
                  parasail_free(ptr_04);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(b_05);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(ptr);
                  parasail_free(b_02);
                  parasail_free(b_01);
                  parasail_free(b_00);
                  parasail_free(b);
                  return ppVar25;
                }
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            cond_max = _mm_cmpgt_epi16(vH, vMaxH);
            vMaxH = _mm_max_epi16(vMaxH, vH);
            vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
            vMaxM = _mm_slli_si128(vMaxM, 2);
            vMaxS = _mm_slli_si128(vMaxS, 2);
            vMaxL = _mm_slli_si128(vMaxL, 2);
        }
        end_query = s1Len-1;
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        matches = (int16_t) _mm_extract_epi16(vMaxM, 7);
        similar = (int16_t) _mm_extract_epi16(vMaxS, 7);
        length = (int16_t) _mm_extract_epi16(vMaxL, 7);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int16_t *m = (int16_t*)pvHM;
        int16_t *s = (int16_t*)pvHS;
        int16_t *l = (int16_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}